

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::Log(cmCTest *this,int logType,char *file,int line,char *msg,bool suppress)

{
  bool bVar1;
  pointer pPVar2;
  type pcVar3;
  ostream *poVar4;
  ostream *poVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined8 local_b8;
  char local_a9;
  char *local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 local_90;
  long local_88;
  size_type lineBreakIt;
  allocator<char> local_69;
  string local_68 [8];
  string msg_str;
  ostream *err;
  ostream *out;
  bool display;
  bool suppress_local;
  char *msg_local;
  int line_local;
  char *file_local;
  int logType_local;
  cmCTest *this_local;
  
  if ((((msg != (char *)0x0) && (*msg != '\0')) && ((!suppress || (logType == 7)))) &&
     ((logType != 3 ||
      ((pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl), (pPVar2->Debug & 1U) == 0 &&
       (pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl), (pPVar2->ExtraVerbose & 1U) == 0)))))) {
    pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pPVar2->OutputLogFile);
    if (bVar1) {
      bVar1 = true;
      if ((logType == 0) &&
         (pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl), (pPVar2->Debug & 1U) == 0)) {
        bVar1 = false;
      }
      if (((logType == 5) &&
          (pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                    operator->(&this->Impl), (pPVar2->Debug & 1U) == 0)) &&
         (pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl), (pPVar2->ExtraVerbose & 1U) == 0)) {
        bVar1 = false;
      }
      if (bVar1) {
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if ((pPVar2->ShowLineNumbers & 1U) != 0) {
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          pcVar3 = std::
                   unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
                   operator*(&pPVar2->OutputLogFile);
          poVar4 = (ostream *)
                   std::ostream::operator<<(pcVar3,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,file);
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
          std::operator<<(poVar4," ");
        }
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if (logType != pPVar2->OutputLogFileLastTag) {
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          pcVar3 = std::
                   unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
                   operator*(&pPVar2->OutputLogFile);
          std::operator<<((ostream *)pcVar3,"[");
          if ((logType < 8) && (-1 < logType)) {
            pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            pcVar3 = std::
                     unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                     ::operator*(&pPVar2->OutputLogFile);
            std::operator<<((ostream *)pcVar3,cmCTestStringLogType[logType]);
          }
          else {
            pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            pcVar3 = std::
                     unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                     ::operator*(&pPVar2->OutputLogFile);
            std::operator<<((ostream *)pcVar3,"OTHER");
          }
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          pcVar3 = std::
                   unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
                   operator*(&pPVar2->OutputLogFile);
          poVar4 = std::operator<<((ostream *)pcVar3,"] ");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator*(&pPVar2->OutputLogFile);
        poVar4 = std::operator<<((ostream *)pcVar3,msg);
        std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if (logType != pPVar2->OutputLogFileLastTag) {
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          pcVar3 = std::
                   unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
                   operator*(&pPVar2->OutputLogFile);
          std::ostream::operator<<(pcVar3,std::endl<char,std::char_traits<char>>);
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          pPVar2->OutputLogFileLastTag = logType;
        }
      }
    }
    pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    if ((pPVar2->Quiet & 1U) == 0) {
      pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      poVar4 = pPVar2->StreamOut;
      pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      msg_str.field_2._8_8_ = pPVar2->StreamErr;
      file_local._4_4_ = logType;
      if (logType == 4) {
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if ((pPVar2->TestProgressOutput & 1U) != 0) {
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          if ((pPVar2->ShowLineNumbers & 1U) != 0) {
            poVar5 = (ostream *)
                     std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,file);
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,line);
            std::operator<<(poVar5," ");
          }
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          if ((pPVar2->FlushTestProgressLine & 1U) != 0) {
            printf("\r");
            pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            pPVar2->FlushTestProgressLine = false;
            std::ostream::flush();
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_68,msg,&local_69);
          std::allocator<char>::~allocator(&local_69);
          local_88 = std::__cxx11::string::find((char)local_68,10);
          if (local_88 != -1) {
            pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            pPVar2->FlushTestProgressLine = true;
            local_a0._M_current = (char *)std::__cxx11::string::begin();
            local_a8 = (char *)std::__cxx11::string::end();
            local_a9 = '\n';
            local_98 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                 (local_a0,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            )local_a8,&local_a9);
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_90,&local_98);
            local_c0._M_current = (char *)std::__cxx11::string::end();
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_b8,&local_c0);
            std::__cxx11::string::erase(local_68,local_90,local_b8);
          }
          std::operator<<(poVar4,local_68);
          printf("\x1b[K");
          std::ostream::flush();
          std::__cxx11::string::~string(local_68);
          return;
        }
        file_local._4_4_ = 2;
      }
      switch(file_local._4_4_) {
      case 0:
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if ((pPVar2->Debug & 1U) != 0) {
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          if ((pPVar2->ShowLineNumbers & 1U) != 0) {
            poVar5 = (ostream *)
                     std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,file);
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,line);
            std::operator<<(poVar5," ");
          }
          std::operator<<(poVar4,msg);
          std::ostream::flush();
        }
        break;
      case 1:
      case 2:
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if (((pPVar2->Debug & 1U) != 0) ||
           (pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl), (pPVar2->Verbose & 1U) != 0)) {
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          if ((pPVar2->ShowLineNumbers & 1U) != 0) {
            poVar5 = (ostream *)
                     std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,file);
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,line);
            std::operator<<(poVar5," ");
          }
          std::operator<<(poVar4,msg);
          std::ostream::flush();
        }
        break;
      default:
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if ((pPVar2->ShowLineNumbers & 1U) != 0) {
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,file);
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,line);
          std::operator<<(poVar5," ");
        }
        std::operator<<(poVar4,msg);
        std::ostream::flush();
        break;
      case 5:
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if (((pPVar2->Debug & 1U) != 0) ||
           (pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl), (pPVar2->ExtraVerbose & 1U) != 0)) {
          pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          if ((pPVar2->ShowLineNumbers & 1U) != 0) {
            poVar5 = (ostream *)
                     std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,file);
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,line);
            std::operator<<(poVar5," ");
          }
          std::operator<<(poVar4,msg);
          std::ostream::flush();
        }
        break;
      case 6:
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if ((pPVar2->ShowLineNumbers & 1U) != 0) {
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             ((void *)msg_str.field_2._8_8_,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,file);
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
          std::operator<<(poVar4," ");
        }
        std::operator<<((ostream *)msg_str.field_2._8_8_,msg);
        std::ostream::flush();
        break;
      case 7:
        pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if ((pPVar2->ShowLineNumbers & 1U) != 0) {
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             ((void *)msg_str.field_2._8_8_,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,file);
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
          std::operator<<(poVar4," ");
        }
        std::operator<<((ostream *)msg_str.field_2._8_8_,msg);
        std::ostream::flush();
        cmSystemTools::SetErrorOccurred();
      }
    }
  }
  return;
}

Assistant:

void cmCTest::Log(int logType, const char* file, int line, const char* msg,
                  bool suppress)
{
  if (!msg || !*msg) {
    return;
  }
  if (suppress && logType != cmCTest::ERROR_MESSAGE) {
    return;
  }
  if (logType == cmCTest::HANDLER_PROGRESS_OUTPUT &&
      (this->Impl->Debug || this->Impl->ExtraVerbose)) {
    return;
  }
  if (this->Impl->OutputLogFile) {
    bool display = true;
    if (logType == cmCTest::DEBUG && !this->Impl->Debug) {
      display = false;
    }
    if (logType == cmCTest::HANDLER_VERBOSE_OUTPUT && !this->Impl->Debug &&
        !this->Impl->ExtraVerbose) {
      display = false;
    }
    if (display) {
      cmCTestLogOutputFileLine(*this->Impl->OutputLogFile);
      if (logType != this->Impl->OutputLogFileLastTag) {
        *this->Impl->OutputLogFile << "[";
        if (logType >= OTHER || logType < 0) {
          *this->Impl->OutputLogFile << "OTHER";
        } else {
          *this->Impl->OutputLogFile << cmCTestStringLogType[logType];
        }
        *this->Impl->OutputLogFile << "] " << std::endl;
      }
      *this->Impl->OutputLogFile << msg << std::flush;
      if (logType != this->Impl->OutputLogFileLastTag) {
        *this->Impl->OutputLogFile << std::endl;
        this->Impl->OutputLogFileLastTag = logType;
      }
    }
  }
  if (!this->Impl->Quiet) {
    std::ostream& out = *this->Impl->StreamOut;
    std::ostream& err = *this->Impl->StreamErr;

    if (logType == HANDLER_TEST_PROGRESS_OUTPUT) {
      if (this->Impl->TestProgressOutput) {
        cmCTestLogOutputFileLine(out);
        if (this->Impl->FlushTestProgressLine) {
          printf("\r");
          this->Impl->FlushTestProgressLine = false;
          out.flush();
        }

        std::string msg_str{ msg };
        auto const lineBreakIt = msg_str.find('\n');
        if (lineBreakIt != std::string::npos) {
          this->Impl->FlushTestProgressLine = true;
          msg_str.erase(std::remove(msg_str.begin(), msg_str.end(), '\n'),
                        msg_str.end());
        }

        out << msg_str;
#ifndef _WIN32
        printf("\x1B[K"); // move caret to end
#endif
        out.flush();
        return;
      }
      logType = HANDLER_OUTPUT;
    }

    switch (logType) {
      case DEBUG:
        if (this->Impl->Debug) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case OUTPUT:
      case HANDLER_OUTPUT:
        if (this->Impl->Debug || this->Impl->Verbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case HANDLER_VERBOSE_OUTPUT:
        if (this->Impl->Debug || this->Impl->ExtraVerbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case WARNING:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        break;
      case ERROR_MESSAGE:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        cmSystemTools::SetErrorOccurred();
        break;
      default:
        cmCTestLogOutputFileLine(out);
        out << msg;
        out.flush();
    }
  }
}